

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coll.cpp
# Opt level: O3

UBool icu_63::isAvailableLocaleListInitialized(UErrorCode *status)

{
  undefined1 auVar1 [16];
  UBool UVar2;
  int32_t iVar3;
  UResourceBundle *resB;
  ulong *puVar4;
  char *size;
  UMemory *this;
  ulong uVar5;
  Locale *this_00;
  long lVar6;
  char *tempKey;
  UResourceBundle installed;
  char *local_1e0;
  UResourceBundle local_1d8;
  Locale local_110;
  
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    if ((gAvailableLocaleListInitOnce.fState.super___atomic_base<int>._M_i == 2) ||
       (UVar2 = umtx_initImplPreInit(&gAvailableLocaleListInitOnce), UVar2 == '\0')) {
      if (U_ZERO_ERROR < gAvailableLocaleListInitOnce.fErrCode) {
        *status = gAvailableLocaleListInitOnce.fErrCode;
      }
    }
    else {
      ures_initStackObject_63(&local_1d8);
      resB = ures_openDirect_63("icudt63l-coll","res_index",status);
      size = "InstalledLocales";
      ures_getByKey_63(resB,"InstalledLocales",&local_1d8,status);
      if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
        iVar3 = ures_getSize_63(&local_1d8);
        uVar5 = (ulong)iVar3;
        auVar1._8_8_ = 0;
        auVar1._0_8_ = uVar5;
        this = (UMemory *)0xffffffffffffffff;
        if (SUB168(auVar1 * ZEXT816(0xe0),8) == 0) {
          this = (UMemory *)(SUB168(auVar1 * ZEXT816(0xe0),0) | 8);
        }
        ::availableLocaleListCount = iVar3;
        puVar4 = (ulong *)UMemory::operator_new__(this,(size_t)size);
        if (puVar4 == (ulong *)0x0) {
          ::availableLocaleList = (Locale *)0x0;
        }
        else {
          *puVar4 = uVar5;
          if (iVar3 != 0) {
            lVar6 = 0;
            this_00 = (Locale *)(puVar4 + 1);
            do {
              Locale::Locale(this_00);
              lVar6 = lVar6 + -0xe0;
              this_00 = this_00 + 1;
            } while (uVar5 * -0xe0 - lVar6 != 0);
          }
          ::availableLocaleList = (Locale *)(puVar4 + 1);
          ures_resetIterator_63(&local_1d8);
          UVar2 = ures_hasNext_63(&local_1d8);
          if (UVar2 != '\0') {
            lVar6 = 0;
            do {
              local_1e0 = (char *)0x0;
              ures_getNextString_63(&local_1d8,(int32_t *)0x0,&local_1e0,status);
              Locale::Locale(&local_110,local_1e0,(char *)0x0,(char *)0x0,(char *)0x0);
              Locale::operator=((Locale *)(::availableLocaleList->language + lVar6 + -8),&local_110)
              ;
              Locale::~Locale(&local_110);
              UVar2 = ures_hasNext_63(&local_1d8);
              lVar6 = lVar6 + 0xe0;
            } while (UVar2 != '\0');
          }
        }
        ures_close_63(&local_1d8);
      }
      ures_close_63(resB);
      ucln_i18n_registerCleanup_63(UCLN_I18N_COLLATOR,collator_cleanup);
      gAvailableLocaleListInitOnce.fErrCode = *status;
      umtx_initImplPostInit(&gAvailableLocaleListInitOnce);
    }
  }
  return *status < U_ILLEGAL_ARGUMENT_ERROR;
}

Assistant:

static UBool isAvailableLocaleListInitialized(UErrorCode &status) {
    umtx_initOnce(gAvailableLocaleListInitOnce, &initAvailableLocaleList, status);
    return U_SUCCESS(status);
}